

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::setScrolledAreaSize(AbstractScrollArea *this,QSize *s)

{
  AbstractScrollAreaPrivate *pAVar1;
  QSize *s_local;
  AbstractScrollArea *this_local;
  
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  pAVar1->scrolledAreaSize = *s;
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::normalizePosition(pAVar1);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::calcIndicators(pAVar1);
  QWidget::update();
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::operator->(&this->d);
  QWidget::update();
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  ::operator->(&this->d);
  QWidget::update();
  return;
}

Assistant:

void
AbstractScrollArea::setScrolledAreaSize( const QSize & s )
{
	d->scrolledAreaSize = s;

	d->normalizePosition();

	d->calcIndicators();

	update();
	d->horIndicator->update();
	d->vertIndicator->update();
}